

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::InvalidConversion::~InvalidConversion(InvalidConversion *this)

{
  void *in_RDI;
  
  ~InvalidConversion((InvalidConversion *)0x3aee38);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit InvalidConversion(
        std::string_view message = "unable to perform the requested conversion") noexcept:
        HelicsException(message)
    {
    }